

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O2

_Bool i2cp_ringbuf_flush(i2cp_ringbuf *b,i2cp_buffer_visitor v,i2cp_state *st)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  bool bVar5;
  
  uVar1 = b->sz;
  if (uVar1 != 0) {
    uVar4 = b->idx;
    uVar3 = uVar1;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) {
        uVar4 = 0x1f;
      }
    }
    iVar2 = 1;
    while ((short)iVar2 != 0) {
      (*v)(b->buffs[uVar4].buf,b->buffs[uVar4].sz,st);
      uVar4 = uVar4 + 1 & 0x1f;
      iVar2 = *(int *)b + -1;
      b->sz = (uint16_t)iVar2;
    }
  }
  return uVar1 != 0;
}

Assistant:

bool i2cp_ringbuf_flush(struct i2cp_ringbuf * b, i2cp_buffer_visitor v, struct i2cp_state * st)
{
  if(b->sz == 0) return false;
  struct i2cp_msgbuf * msg;
  uint16_t sz = b->sz;
  uint16_t idx = b->idx;
  while(sz)
  {
    if(idx)
      idx = idx - 1;
    else
      idx = RINGBUF_SZ - 1;
    sz--; 
  }
  while(b->sz)
  {
    msg = &b->buffs[idx];
    v(msg->buf, msg->sz, st);
    idx = (idx + 1) % RINGBUF_SZ;
    b->sz --;
  }
  return true;
}